

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  pointer ppTVar1;
  TestSuite *pTVar2;
  pointer ppTVar3;
  TestInfo *pTVar4;
  bool bVar5;
  bool bVar6;
  pointer ppTVar7;
  byte bVar8;
  int iVar9;
  undefined4 in_register_00000034;
  string *filter;
  int iVar10;
  pointer ppTVar11;
  bool bVar12;
  UnitTestFilter disable_test_filter;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  int local_170;
  int local_16c;
  string local_140;
  UnitTestFilter local_120;
  PositiveAndNegativeUnitTestFilter local_d0;
  
  filter = (string *)CONCAT44(in_register_00000034,shard_tests);
  local_16c = -1;
  local_170 = -1;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_16c = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    filter = (string *)0xffffffff;
    local_170 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  anon_unknown_35::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (&local_d0,filter);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"DISABLED_*:*/DISABLED_*","")
  ;
  anon_unknown_35::UnitTestFilter::UnitTestFilter(&local_120,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  ppTVar7 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar7 == ppTVar1) {
    iVar9 = 0;
  }
  else {
    iVar10 = 0;
    iVar9 = 0;
    do {
      pTVar2 = *ppTVar7;
      pTVar2->should_run_ = false;
      ppTVar11 = (pTVar2->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar11 != ppTVar3) {
        do {
          pTVar4 = *ppTVar11;
          bVar5 = anon_unknown_35::UnitTestFilter::MatchesName(&local_120,&pTVar2->name_);
          bVar6 = true;
          if (!bVar5) {
            bVar6 = anon_unknown_35::UnitTestFilter::MatchesName(&local_120,&pTVar4->name_);
          }
          pTVar4->is_disabled_ = bVar6;
          bVar5 = anon_unknown_35::PositiveAndNegativeUnitTestFilter::MatchesTest
                            (&local_d0,(string *)(pTVar2->name_)._M_dataplus._M_p,
                             (string *)(pTVar2->name_)._M_string_length);
          pTVar4->matches_filter_ = bVar5;
          bVar12 = iVar10 % local_16c != local_170;
          bVar8 = bVar5 & (bVar6 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
          pTVar4->is_in_another_shard_ = shard_tests != IGNORE_SHARDING_PROTOCOL && bVar12;
          bVar5 = (bool)((shard_tests == IGNORE_SHARDING_PROTOCOL || !bVar12) & bVar8);
          pTVar4->should_run_ = bVar5;
          pTVar2->should_run_ = (bool)(pTVar2->should_run_ | bVar5);
          iVar10 = iVar10 + (uint)bVar8;
          iVar9 = iVar9 + (uint)bVar5;
          ppTVar11 = ppTVar11 + 1;
        } while (ppTVar11 != ppTVar3);
      }
      ppTVar7 = ppTVar7 + 1;
    } while (ppTVar7 != ppTVar1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_120.exact_match_patterns_._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120.glob_patterns_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_d0.negative_filter_.exact_match_patterns_._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.negative_filter_.glob_patterns_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_d0.positive_filter_.exact_match_patterns_._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d0);
  return iVar9;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name_;
    test_suite->set_should_run(false);

    for (TestInfo* test_info : test_suite->test_info_list()) {
      const std::string& test_name = test_info->name_;
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}